

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::EvalOperator
          (LoopPeelingInfo *this,CmpOperator cmp_op,SExpression lhs,SExpression rhs,bool *result)

{
  bool bVar1;
  SENode *pSVar2;
  ScalarEvolutionAnalysis *pSVar3;
  SENode *node;
  SExpression SVar4;
  SExpression local_48;
  SExpression local_38;
  
  local_38.scev_ = lhs.scev_;
  pSVar2 = lhs.node_;
  local_48.scev_ = rhs.scev_;
  node = rhs.node_;
  local_48.node_ = node;
  local_38.node_ = pSVar2;
  bVar1 = ScalarEvolutionAnalysis::IsLoopInvariant(this->scev_analysis_,this->loop_,pSVar2);
  if (!bVar1) {
    __assert_fail("scev_analysis_->IsLoopInvariant(loop_, lhs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x3c3,
                  "bool spvtools::opt::LoopPeelingPass::LoopPeelingInfo::EvalOperator(CmpOperator, SExpression, SExpression, bool *) const"
                 );
  }
  bVar1 = ScalarEvolutionAnalysis::IsLoopInvariant(this->scev_analysis_,this->loop_,node);
  if (!bVar1) {
    __assert_fail("scev_analysis_->IsLoopInvariant(loop_, rhs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x3c4,
                  "bool spvtools::opt::LoopPeelingPass::LoopPeelingInfo::EvalOperator(CmpOperator, SExpression, SExpression, bool *) const"
                 );
  }
  switch(cmp_op) {
  case kLT:
    pSVar3 = this->scev_analysis_;
    SVar4 = SExpression::operator-(&local_48,pSVar2);
    pSVar2 = SVar4.node_;
    break;
  case kGT:
    pSVar3 = this->scev_analysis_;
    SVar4 = SExpression::operator-(&local_38,node);
    pSVar2 = SVar4.node_;
    break;
  case kLE:
    pSVar3 = this->scev_analysis_;
    SVar4 = SExpression::operator-(&local_48,pSVar2);
    pSVar2 = SVar4.node_;
    goto LAB_00515f9a;
  case kGE:
    pSVar3 = this->scev_analysis_;
    SVar4 = SExpression::operator-(&local_38,node);
    pSVar2 = SVar4.node_;
LAB_00515f9a:
    bVar1 = ScalarEvolutionAnalysis::IsAlwaysGreaterOrEqualToZero(pSVar3,pSVar2,result);
    return bVar1;
  default:
    return false;
  }
  bVar1 = ScalarEvolutionAnalysis::IsAlwaysGreaterThanZero(pSVar3,pSVar2,result);
  return bVar1;
}

Assistant:

bool LoopPeelingPass::LoopPeelingInfo::EvalOperator(CmpOperator cmp_op,
                                                    SExpression lhs,
                                                    SExpression rhs,
                                                    bool* result) const {
  assert(scev_analysis_->IsLoopInvariant(loop_, lhs));
  assert(scev_analysis_->IsLoopInvariant(loop_, rhs));
  // We perform the test: 0 cmp_op rhs - lhs
  // What is left is then to determine the sign of the expression.
  switch (cmp_op) {
    case CmpOperator::kLT: {
      return scev_analysis_->IsAlwaysGreaterThanZero(rhs - lhs, result);
    }
    case CmpOperator::kGT: {
      return scev_analysis_->IsAlwaysGreaterThanZero(lhs - rhs, result);
    }
    case CmpOperator::kLE: {
      return scev_analysis_->IsAlwaysGreaterOrEqualToZero(rhs - lhs, result);
    }
    case CmpOperator::kGE: {
      return scev_analysis_->IsAlwaysGreaterOrEqualToZero(lhs - rhs, result);
    }
  }
  return false;
}